

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_>::erase
          (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *this,Bucket bucket)

{
  byte bVar1;
  Span<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *pSVar2;
  size_t bucket_00;
  Span<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *this_00;
  Span<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *pSVar3;
  Span<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *pSVar4;
  Span<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *this_01;
  size_t sVar5;
  ulong uVar6;
  size_t fromIndex;
  
  bucket_00 = bucket.index;
  this_00 = bucket.span;
  Span<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_>::erase(this_00,bucket_00);
  this->size = this->size - 1;
  this_01 = this_00;
  fromIndex = bucket_00;
  do {
    pSVar2 = this->spans;
    fromIndex = fromIndex + 1;
    if (fromIndex == 0x80) {
      this_00 = this_00 + 1;
      if (((long)this_00 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7) == 0)
      {
        this_00 = pSVar2;
      }
      fromIndex = 0;
    }
    bVar1 = this_00->offsets[fromIndex];
    if ((ulong)bVar1 != 0xff) {
      uVar6 = this->seed ^ *(ulong *)this_00->entries[bVar1].storage.data;
      uVar6 = (uVar6 >> 0x20 ^ uVar6) * -0x2917014799a6026d;
      uVar6 = (uVar6 >> 0x20 ^ uVar6) * -0x2917014799a6026d;
      uVar6 = this->numBuckets - 1 & (uVar6 >> 0x20 ^ uVar6);
      pSVar3 = pSVar2 + (uVar6 >> 7);
      sVar5 = (size_t)((uint)uVar6 & 0x7f);
      if (sVar5 != fromIndex || pSVar3 != this_00) {
        do {
          if ((pSVar3 == this_01) && (sVar5 == bucket_00)) {
            if (this_00 == this_01) {
              this_01->offsets[bucket_00] = this_01->offsets[fromIndex];
              this_01->offsets[fromIndex] = 0xff;
              bucket_00 = fromIndex;
              this_01 = this_00;
            }
            else {
              Span<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_>::moveFromSpan
                        (this_01,this_00,fromIndex,bucket_00);
              bucket_00 = fromIndex;
              this_01 = this_00;
            }
            break;
          }
          sVar5 = sVar5 + 1;
          if (sVar5 == 0x80) {
            pSVar4 = pSVar3 + 1;
            pSVar3 = pSVar2;
            if (((long)pSVar4 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7)
                != 0) {
              pSVar3 = pSVar4;
            }
            sVar5 = 0;
          }
        } while ((pSVar3 != this_00) || (sVar5 != fromIndex));
      }
    }
    if (bVar1 == 0xff) {
      return;
    }
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }